

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.h
# Opt level: O2

int waitforcliforudpsrv(SOCKET socksrv,SOCKET *pSockCli,int timeout)

{
  uint __i;
  int iVar1;
  long lVar2;
  ssize_t sVar3;
  int iVar4;
  timeval *__timeout;
  ulong uVar5;
  socklen_t sStack_1056c;
  timeval tv;
  fd_set sock_set;
  char service [32];
  sockaddr_storage addr;
  char hostname [1025];
  char buf [65535];
  
  tv.tv_sec = (__time_t)(timeout / 1000);
  tv.tv_usec = (__suseconds_t)((timeout % 1000) * 1000);
  *pSockCli = -1;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    sock_set.fds_bits[lVar2] = 0;
  }
  uVar5 = 1L << ((byte)socksrv & 0x3f);
  sock_set.fds_bits[socksrv / 0x40] = sock_set.fds_bits[socksrv / 0x40] | uVar5;
  if (timeout == 0) {
    __timeout = (timeval *)0x0;
  }
  else {
    __timeout = &tv;
  }
  iVar1 = select(socksrv + 1,(fd_set *)&sock_set,(fd_set *)0x0,(fd_set *)0x0,(timeval *)__timeout);
  sock_set.fds_bits[socksrv / 0x40] = sock_set.fds_bits[socksrv / 0x40] & ~uVar5;
  iVar4 = 1;
  if (iVar1 != -1) {
    if (iVar1 == 0) {
      iVar4 = 2;
    }
    else {
      addr.__ss_padding[0x6e] = '\0';
      addr.__ss_padding[0x6f] = '\0';
      addr.__ss_padding[0x70] = '\0';
      addr.__ss_padding[0x71] = '\0';
      addr.__ss_padding[0x72] = '\0';
      addr.__ss_padding[0x73] = '\0';
      addr.__ss_padding[0x74] = '\0';
      addr.__ss_padding[0x75] = '\0';
      addr.__ss_align = 0;
      addr.__ss_padding[0x5e] = '\0';
      addr.__ss_padding[0x5f] = '\0';
      addr.__ss_padding[0x60] = '\0';
      addr.__ss_padding[0x61] = '\0';
      addr.__ss_padding[0x62] = '\0';
      addr.__ss_padding[99] = '\0';
      addr.__ss_padding[100] = '\0';
      addr.__ss_padding[0x65] = '\0';
      addr.__ss_padding[0x66] = '\0';
      addr.__ss_padding[0x67] = '\0';
      addr.__ss_padding[0x68] = '\0';
      addr.__ss_padding[0x69] = '\0';
      addr.__ss_padding[0x6a] = '\0';
      addr.__ss_padding[0x6b] = '\0';
      addr.__ss_padding[0x6c] = '\0';
      addr.__ss_padding[0x6d] = '\0';
      addr.__ss_padding[0x4e] = '\0';
      addr.__ss_padding[0x4f] = '\0';
      addr.__ss_padding[0x50] = '\0';
      addr.__ss_padding[0x51] = '\0';
      addr.__ss_padding[0x52] = '\0';
      addr.__ss_padding[0x53] = '\0';
      addr.__ss_padding[0x54] = '\0';
      addr.__ss_padding[0x55] = '\0';
      addr.__ss_padding[0x56] = '\0';
      addr.__ss_padding[0x57] = '\0';
      addr.__ss_padding[0x58] = '\0';
      addr.__ss_padding[0x59] = '\0';
      addr.__ss_padding[0x5a] = '\0';
      addr.__ss_padding[0x5b] = '\0';
      addr.__ss_padding[0x5c] = '\0';
      addr.__ss_padding[0x5d] = '\0';
      addr.__ss_padding[0x3e] = '\0';
      addr.__ss_padding[0x3f] = '\0';
      addr.__ss_padding[0x40] = '\0';
      addr.__ss_padding[0x41] = '\0';
      addr.__ss_padding[0x42] = '\0';
      addr.__ss_padding[0x43] = '\0';
      addr.__ss_padding[0x44] = '\0';
      addr.__ss_padding[0x45] = '\0';
      addr.__ss_padding[0x46] = '\0';
      addr.__ss_padding[0x47] = '\0';
      addr.__ss_padding[0x48] = '\0';
      addr.__ss_padding[0x49] = '\0';
      addr.__ss_padding[0x4a] = '\0';
      addr.__ss_padding[0x4b] = '\0';
      addr.__ss_padding[0x4c] = '\0';
      addr.__ss_padding[0x4d] = '\0';
      addr.__ss_padding[0x2e] = '\0';
      addr.__ss_padding[0x2f] = '\0';
      addr.__ss_padding[0x30] = '\0';
      addr.__ss_padding[0x31] = '\0';
      addr.__ss_padding[0x32] = '\0';
      addr.__ss_padding[0x33] = '\0';
      addr.__ss_padding[0x34] = '\0';
      addr.__ss_padding[0x35] = '\0';
      addr.__ss_padding[0x36] = '\0';
      addr.__ss_padding[0x37] = '\0';
      addr.__ss_padding[0x38] = '\0';
      addr.__ss_padding[0x39] = '\0';
      addr.__ss_padding[0x3a] = '\0';
      addr.__ss_padding[0x3b] = '\0';
      addr.__ss_padding[0x3c] = '\0';
      addr.__ss_padding[0x3d] = '\0';
      addr.__ss_padding[0x1e] = '\0';
      addr.__ss_padding[0x1f] = '\0';
      addr.__ss_padding[0x20] = '\0';
      addr.__ss_padding[0x21] = '\0';
      addr.__ss_padding[0x22] = '\0';
      addr.__ss_padding[0x23] = '\0';
      addr.__ss_padding[0x24] = '\0';
      addr.__ss_padding[0x25] = '\0';
      addr.__ss_padding[0x26] = '\0';
      addr.__ss_padding[0x27] = '\0';
      addr.__ss_padding[0x28] = '\0';
      addr.__ss_padding[0x29] = '\0';
      addr.__ss_padding[0x2a] = '\0';
      addr.__ss_padding[0x2b] = '\0';
      addr.__ss_padding[0x2c] = '\0';
      addr.__ss_padding[0x2d] = '\0';
      addr.__ss_padding[0xe] = '\0';
      addr.__ss_padding[0xf] = '\0';
      addr.__ss_padding[0x10] = '\0';
      addr.__ss_padding[0x11] = '\0';
      addr.__ss_padding[0x12] = '\0';
      addr.__ss_padding[0x13] = '\0';
      addr.__ss_padding[0x14] = '\0';
      addr.__ss_padding[0x15] = '\0';
      addr.__ss_padding[0x16] = '\0';
      addr.__ss_padding[0x17] = '\0';
      addr.__ss_padding[0x18] = '\0';
      addr.__ss_padding[0x19] = '\0';
      addr.__ss_padding[0x1a] = '\0';
      addr.__ss_padding[0x1b] = '\0';
      addr.__ss_padding[0x1c] = '\0';
      addr.__ss_padding[0x1d] = '\0';
      addr.ss_family = 0;
      addr.__ss_padding[0] = '\0';
      addr.__ss_padding[1] = '\0';
      addr.__ss_padding[2] = '\0';
      addr.__ss_padding[3] = '\0';
      addr.__ss_padding[4] = '\0';
      addr.__ss_padding[5] = '\0';
      addr.__ss_padding[6] = '\0';
      addr.__ss_padding[7] = '\0';
      addr.__ss_padding[8] = '\0';
      addr.__ss_padding[9] = '\0';
      addr.__ss_padding[10] = '\0';
      addr.__ss_padding[0xb] = '\0';
      addr.__ss_padding[0xc] = '\0';
      addr.__ss_padding[0xd] = '\0';
      sStack_1056c = 0x80;
      sVar3 = recvfrom(socksrv,buf,0xffff,0,(sockaddr *)&addr,&sStack_1056c);
      if (-1 < sVar3) {
        iVar1 = connect(socksrv,(sockaddr *)&addr,sStack_1056c);
        if (iVar1 == 0) {
          iVar1 = getnameinfo((sockaddr *)&addr,sStack_1056c,hostname,0x401,service,0x20,3);
          if (iVar1 == 0) {
            *pSockCli = socksrv;
            iVar4 = 0;
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

inline int waitforcliforudpsrv(SOCKET socksrv, SOCKET* pSockCli, int timeout)
{
	fd_set sock_set;
	int iResult = SOCKET_ERROR;
	struct timeval tv;
	struct sockaddr_storage addr;
	socklen_t addrlen = sizeof(struct sockaddr_storage);
	char hostname[NI_MAXHOST];
	char service[NI_MAXSERV];
	char buf[65535];

	tv.tv_sec = (long)(timeout/1000);
	tv.tv_usec = (long)((timeout%1000)*1000);

	*pSockCli = INVALID_SOCKET;

	// Initialize a fd_set and add the server socket to it.
	FD_ZERO(&sock_set); 
	FD_SET(socksrv, &sock_set);

	// Wait for the readability of the socket in the fd_set, with a timeout.
	if (timeout != 0)
	{
		iResult = select((int)socksrv+1, &sock_set, NULL, NULL, &tv);
	}
	else
	{
		iResult = select((int)socksrv+1, &sock_set, NULL, NULL, NULL);
	}

	// Remove the server socket from the set.
	// No need to use FD_ISSET() here, as we only have one socket the return value of select() is 
	// sufficient to know what happened.
	FD_CLR(socksrv, &sock_set); 

	if (iResult == SOCKET_ERROR)
	{
		PRINT_DEBUG_ERROR_OSNET(("waitforcliforudpsrv error (%s) : %s(socksrv=%d, timeout=%d)\n", 
			strtime_m(), 
			"select failed. ", 
			(int)socksrv, timeout));
		return EXIT_FAILURE;
	}

	if (iResult == 0)
	{ 
		PRINT_DEBUG_MESSAGE_OSNET(("waitforcliforudpsrv message (%s) : %s(socksrv=%d, timeout=%d)\n", 
			strtime_m(), 
			"select timed out. ", 
			(int)socksrv, timeout));
		return EXIT_TIMEOUT;
	}

	// First datagram will be lost...
	memset(&addr, 0, sizeof(addr));
	addrlen = sizeof(addr);
	if (recvfrom(socksrv, buf, sizeof(buf), 0, (struct sockaddr*)&addr, (socklen_t*)&addrlen) < 0)
	{
		PRINT_DEBUG_ERROR_OSNET(("waitforcliforudpsrv error (%s) : %s(socksrv=%d, timeout=%d)\n", 
			strtime_m(), 
			WSAGetLastErrorMsg(), 
			(int)socksrv, timeout));
		return EXIT_FAILURE;
	}

	// Should create a new socket connected to that client...?

	//// Create a UDP IPv4 socket.
	//*pSockCli = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP);
	//if (*pSockCli == INVALID_SOCKET)
	//{
	//	PRINT_DEBUG_ERROR_OSNET(("waitforcliforudpsrv error (%s) : %s(socksrv=%d, timeout=%d)\n", 
	//		strtime_m(), 
	//		WSAGetLastErrorMsg(), 
	//		(int)socksrv, timeout));
	//	return EXIT_FAILURE;
	//}

	//// Configure timeouts for send and recv.
	//if (setsockettimeouts(*pSockCli, DEFAULT_SOCK_TIMEOUT) != EXIT_SUCCESS)
	//{
	//	PRINT_DEBUG_ERROR_OSNET(("waitforcliforudpsrv error (%s) : %s(socksrv=%d, timeout=%d)\n", 
	//		strtime_m(), 
	//		WSAGetLastErrorMsg(), 
	//		(int)socksrv, timeout));
	//	closesocket(*pSockCli);
	//	return EXIT_FAILURE;
	//}
	
	// Set defaults for recv()... and send()...
	//if (connect(*pSockCli, (struct sockaddr*)&addr, addrlen) != EXIT_SUCCESS)
	if (connect(socksrv, (struct sockaddr*)&addr, addrlen) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("waitforcliforudpsrv error (%s) : %s(socksrv=%d, timeout=%d)\n", 
			strtime_m(), 
			WSAGetLastErrorMsg(), 
			(int)socksrv, timeout));
		//closesocket(*pSockCli);
		return EXIT_FAILURE;
	}

	// Display hostname and service.
	if (getnameinfo((struct sockaddr*)&addr, addrlen, hostname, NI_MAXHOST, service,
		NI_MAXSERV, NI_NUMERICHOST|NI_NUMERICSERV) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("waitforcliforudpsrv error (%s) : %s(socksrv=%d, timeout=%d)\n", 
			strtime_m(), 
			"getnameinfo failed. ", 
			(int)socksrv, timeout));
		//closesocket(*pSockCli);
		return EXIT_FAILURE;
	}

	PRINT_DEBUG_MESSAGE_OSNET(("Accepted connection from host %s and port %s\n", hostname, service));

	*pSockCli = socksrv;

	return EXIT_SUCCESS;
}